

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

void V_DrawBorder(int x1,int y1,int x2,int y2)

{
  DFrameBuffer *pDVar1;
  uint uVar2;
  FTextureID FVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  FTexture *pFVar7;
  FTextureID local_1c;
  uint local_18;
  FTextureID picnum;
  int y2_local;
  int x2_local;
  int y1_local;
  int x1_local;
  
  local_18 = y2;
  picnum.texnum = x2;
  FTextureID::FTextureID(&local_1c);
  if (level.info != (level_info_t *)0x0) {
    sVar5 = FString::Len(&(level.info)->BorderTexture);
    if (sVar5 != 0) {
      pcVar6 = FString::operator_cast_to_char_(&(level.info)->BorderTexture);
      local_1c = FTextureManager::CheckForTexture(&TexMan,pcVar6,2,1);
      goto LAB_0072c592;
    }
  }
  pcVar6 = FString::operator_cast_to_char_(&gameinfo.BorderFlat);
  local_1c = FTextureManager::CheckForTexture(&TexMan,pcVar6,2,1);
LAB_0072c592:
  bVar4 = FTextureID::isValid(&local_1c);
  FVar3 = picnum;
  uVar2 = local_18;
  pDVar1 = screen;
  if (bVar4) {
    pFVar7 = FTextureManager::operator()(&TexMan,local_1c,false);
    (*(pDVar1->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xf])
              (pDVar1,(ulong)(uint)x1,(ulong)(uint)y1,(ulong)(uint)FVar3.texnum,(ulong)uVar2,pFVar7,
               0);
  }
  else {
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
              (screen,(ulong)(uint)x1,(ulong)(uint)y1,(ulong)(uint)picnum.texnum,(ulong)local_18,0,0
              );
  }
  return;
}

Assistant:

void V_DrawBorder (int x1, int y1, int x2, int y2)
{
	FTextureID picnum;

	if (level.info != NULL && level.info->BorderTexture.Len() != 0)
	{
		picnum = TexMan.CheckForTexture (level.info->BorderTexture, FTexture::TEX_Flat);
	}
	else
	{
		picnum = TexMan.CheckForTexture (gameinfo.BorderFlat, FTexture::TEX_Flat);
	}

	if (picnum.isValid())
	{
		screen->FlatFill (x1, y1, x2, y2, TexMan(picnum));
	}
	else
	{
		screen->Clear (x1, y1, x2, y2, 0, 0);
	}
}